

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xsxsigdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 dst;
  TCGv_i64 c2;
  TCGv_i64 c2_00;
  uintptr_t o;
  uintptr_t o_4;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o_3;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    ret_01 = tcg_temp_new_i64(tcg_ctx);
    dst = tcg_temp_new_i64(tcg_ctx);
    c2 = tcg_const_i64_ppc64(tcg_ctx,0);
    c2_00 = tcg_const_i64_ppc64(tcg_ctx,0x7ff);
    get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret_00,dst,0x34,0xb);
    tcg_gen_movi_i64_ppc64(tcg_ctx,ret_01,0x10000000000000);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_01,ret_00,c2,c2,ret_01);
    tcg_gen_movcond_i64_ppc64(tcg_ctx,TCG_COND_EQ,ret_01,ret_00,c2_00,c2,ret_01);
    get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4);
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,ret_01,dst,0,0x34);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(c2_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xsxsigdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv rt = cpu_gpr[rD(ctx->opcode)];
    TCGv_i64 t0, t1, zr, nan, exp;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    exp = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    zr = tcg_const_i64(tcg_ctx, 0);
    nan = tcg_const_i64(tcg_ctx, 2047);

    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_extract_i64(tcg_ctx, exp, t1, 52, 11);
    tcg_gen_movi_i64(tcg_ctx, t0, 0x0010000000000000);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, zr, zr, t0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t0, exp, nan, zr, t0);
    get_cpu_vsrh(tcg_ctx, t1, xB(ctx->opcode));
    tcg_gen_deposit_i64(tcg_ctx, rt, t0, t1, 0, 52);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, exp);
    tcg_temp_free_i64(tcg_ctx, zr);
    tcg_temp_free_i64(tcg_ctx, nan);
}